

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<pollfd>::emplace<pollfd>
          (QPodArrayOps<pollfd> *this,qsizetype i,pollfd *args)

{
  pollfd **pppVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  pollfd pVar5;
  pollfd *ppVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<pollfd>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_003d0b0e:
    pVar5 = *args;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<pollfd>).size != 0);
    QArrayDataPointer<pollfd>::detachAndGrow
              (&this->super_QArrayDataPointer<pollfd>,where,1,(pollfd **)0x0,
               (QArrayDataPointer<pollfd> *)0x0);
    ppVar6 = createHole(this,where,i,1);
    *ppVar6 = pVar5;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<pollfd>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<pollfd>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      (this->super_QArrayDataPointer<pollfd>).ptr[lVar4] = *args;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((pollfd *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<pollfd>).ptr)) goto LAB_003d0b0e;
      (this->super_QArrayDataPointer<pollfd>).ptr[-1] = *args;
      pppVar1 = &(this->super_QArrayDataPointer<pollfd>).ptr;
      *pppVar1 = *pppVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<pollfd>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }